

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

void __thiscall
ON_ComponentManifestItem::ON_ComponentManifestItem
          (ON_ComponentManifestItem *this,ON_ModelComponent *component,ON_UUID *manifest_id,
          ON_NameHash *manifest_name_hash)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  Type TVar3;
  ON__UINT64 OVar4;
  ON_NameHash *manifest_name_hash_local;
  ON_UUID *manifest_id_local;
  ON_ModelComponent *component_local;
  ON_ComponentManifestItem *this_local;
  
  this->m_status_bits = 0;
  TVar3 = ON_ModelComponent::ComponentType(component);
  this->m_component_type = TVar3;
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  this->m_reserved3 = 0;
  this->m_index = -0x7fffffff;
  OVar4 = ON_ModelComponent::RuntimeSerialNumber(component);
  this->m_component_runtime_serial_number = OVar4;
  uVar1 = manifest_id->Data2;
  uVar2 = manifest_id->Data3;
  (this->m_id).Data1 = manifest_id->Data1;
  (this->m_id).Data2 = uVar1;
  (this->m_id).Data3 = uVar2;
  *(undefined8 *)(this->m_id).Data4 = *(undefined8 *)manifest_id->Data4;
  memcpy(&this->m_name_hash,manifest_name_hash,0x28);
  return;
}

Assistant:

ON_ComponentManifestItem::ON_ComponentManifestItem(
  const class ON_ModelComponent& component,
  const ON_UUID& manifest_id,
  const class ON_NameHash& manifest_name_hash
  )
  : m_component_type(component.ComponentType())
  , m_component_runtime_serial_number(component.RuntimeSerialNumber())
  , m_id(manifest_id)
  , m_name_hash(manifest_name_hash)
{}